

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O0

void __thiscall CoreML::Result::Result(Result *this)

{
  allocator local_31;
  string local_30;
  Result *this_local;
  
  local_30._M_storage._M_storage = (uchar  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"not an error",&local_31);
  Result(this,NO_ERROR,UNKNOWN,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

Result::Result()
    : Result(ResultType::NO_ERROR, ResultReason::UNKNOWN, "not an error")
  { }